

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.h
# Opt level: O2

PClassWeapon * dyn_cast<PClassWeapon>(DObject *p)

{
  bool bVar1;
  
  if ((p != (DObject *)0x0) &&
     (bVar1 = DObject::IsKindOf(p,PClassWeapon::RegistrationInfo.MyClass), bVar1)) {
    return (PClassWeapon *)p;
  }
  return (PClassWeapon *)0x0;
}

Assistant:

T *dyn_cast(DObject *p)
{
	if (p != NULL && p->IsKindOf(RUNTIME_CLASS_CASTLESS(T)))
	{
		return static_cast<T *>(p);
	}
	return NULL;
}